

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

int make_var_live(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  VARR_live_range_t *varr;
  ulong ix;
  int iVar1;
  live_range_t_conflict plVar2;
  lr_ctx *plVar3;
  
  ix = (ulong)var;
  plVar2 = VARR_live_range_tget(gen_ctx->lr_ctx->var_live_ranges,ix);
  plVar3 = gen_ctx->lr_ctx;
  if ((insn_p != 0) && (plVar3->scan_vars_num == 0)) {
    bitmap_set_bit_p(plVar3->referenced_vars,ix);
    plVar3 = gen_ctx->lr_ctx;
  }
  iVar1 = bitmap_set_bit_p(plVar3->live_vars,(long)scan_var);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    if ((((insn_p == 0) || (plVar2 == (live_range_t_conflict)0x0)) ||
        (plVar2->lr_bb != (lr_bb_t_conflict)0x0)) ||
       (plVar2->finish + 1 != point && plVar2->finish != point)) {
      varr = gen_ctx->lr_ctx->var_live_ranges;
      plVar2 = create_live_range(gen_ctx,point,-1,plVar2);
      VARR_live_range_tset(varr,ix,plVar2);
    }
  }
  return iVar1;
}

Assistant:

static inline int make_var_live (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  if (!bitmap_set_bit_p (live_vars, scan_var)) return FALSE;
  /* Always start new live range for starting living at bb end or if
     the last live range is covering a whole bb: */
  if (!insn_p || lr == NULL || lr->lr_bb != NULL
      || (lr->finish != point && lr->finish + 1 != point)) {
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, -1, lr));
  }
  return TRUE;
}